

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

Bool WantIndent(TidyDocImpl *doc)

{
  int iVar1;
  uint uVar2;
  Bool BVar3;
  
  iVar1 = (doc->pprint).indent[0].spaces;
  BVar3 = (Bool)(0 < iVar1);
  if (0 < iVar1) {
    uVar2 = (doc->pprint).wraphere;
    iVar1 = (doc->pprint).indent[0].attrValStart;
    if (((iVar1 == 0 || iVar1 < (int)uVar2 && 0 < iVar1) &&
        (*(int *)((doc->config).value + 0x23) == 0)) ||
       (iVar1 = (doc->pprint).indent[0].attrStringStart, iVar1 == 0)) {
      BVar3 = no;
    }
    else {
      BVar3 = (Bool)((int)uVar2 <= iVar1 || iVar1 < 1);
    }
  }
  return BVar3;
}

Assistant:

static Bool WantIndent( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wantIt = GetSpaces(pprint) > 0;
    if ( wantIt )
    {
        Bool indentAttrs = cfgBool( doc, TidyIndentAttributes );
        wantIt = ( ( !IsWrapInAttrVal(pprint) || indentAttrs ) &&
                   !IsWrapInString(pprint) );
    }
    return wantIt;
}